

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

aiNodeAnim * __thiscall
Assimp::FBX::FBXConverter::GenerateScalingNodeAnim
          (FBXConverter *this,string *name,Model *param_2,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time)

{
  aiNodeAnim *this_00;
  pointer paVar1;
  aiQuatKey *paVar2;
  aiVectorKey *paVar3;
  aiVectorKey *local_b8;
  aiQuatKey *local_90;
  aiVector3t<float> local_68;
  aiQuaterniont<float> local_5c;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> local_40;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> na;
  int64_t start_local;
  LayerMap *layer_map_local;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *curves_local;
  Model *param_2_local;
  string *name_local;
  FBXConverter *this_local;
  
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)start;
  this_00 = (aiNodeAnim *)operator_new(0x438);
  aiNodeAnim::aiNodeAnim(this_00);
  std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>::
  unique_ptr<std::default_delete<aiNodeAnim>,void>
            ((unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>> *)&local_40,this_00);
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_40);
  aiString::Set(&paVar1->mNodeName,name);
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::get(&local_40);
  ConvertScaleKeys(this,paVar1,curves,layer_map,
                   (int64_t)na._M_t.
                            super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t
                            .super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,stop,max_time,
                   min_time);
  paVar2 = (aiQuatKey *)operator_new__(0x18);
  local_90 = paVar2;
  do {
    aiQuatKey::aiQuatKey(local_90);
    local_90 = local_90 + 1;
  } while (local_90 != paVar2 + 1);
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_40);
  paVar1->mRotationKeys = paVar2;
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_40);
  paVar1->mNumRotationKeys = 1;
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_40);
  paVar1->mRotationKeys->mTime = 0.0;
  aiQuaterniont<float>::aiQuaterniont(&local_5c);
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_40);
  paVar2 = paVar1->mRotationKeys;
  (paVar2->mValue).w = local_5c.w;
  (paVar2->mValue).x = local_5c.x;
  (paVar2->mValue).y = local_5c.y;
  (paVar2->mValue).z = local_5c.z;
  paVar3 = (aiVectorKey *)operator_new__(0x18);
  local_b8 = paVar3;
  do {
    aiVectorKey::aiVectorKey(local_b8);
    local_b8 = local_b8 + 1;
  } while (local_b8 != paVar3 + 1);
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_40);
  paVar1->mPositionKeys = paVar3;
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_40);
  paVar1->mNumPositionKeys = 1;
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_40);
  paVar1->mPositionKeys->mTime = 0.0;
  aiVector3t<float>::aiVector3t(&local_68);
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_40);
  paVar3 = paVar1->mPositionKeys;
  (paVar3->mValue).x = local_68.x;
  (paVar3->mValue).y = local_68.y;
  (paVar3->mValue).z = local_68.z;
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::release(&local_40);
  std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(&local_40);
  return paVar1;
}

Assistant:

aiNodeAnim* FBXConverter::GenerateScalingNodeAnim(const std::string& name,
            const Model& /*target*/,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time)
        {
            std::unique_ptr<aiNodeAnim> na(new aiNodeAnim());
            na->mNodeName.Set(name);

            ConvertScaleKeys(na.get(), curves, layer_map, start, stop, max_time, min_time);

            // dummy rotation key
            na->mRotationKeys = new aiQuatKey[1];
            na->mNumRotationKeys = 1;

            na->mRotationKeys[0].mTime = 0.;
            na->mRotationKeys[0].mValue = aiQuaternion();

            // dummy position key
            na->mPositionKeys = new aiVectorKey[1];
            na->mNumPositionKeys = 1;

            na->mPositionKeys[0].mTime = 0.;
            na->mPositionKeys[0].mValue = aiVector3D();

            return na.release();
        }